

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int MRIStepSetPreInnerFn(void *arkode_mem,MRIStepPreInnerFn prefn)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepSetPreInnerFn",&local_10,&local_18);
  if (iVar1 == 0) {
    local_18->pre_inner_evolve = prefn;
  }
  return iVar1;
}

Assistant:

int MRIStepSetPreInnerFn(void* arkode_mem, MRIStepPreInnerFn prefn)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set pre inner evolve function */
  step_mem->pre_inner_evolve = prefn;

  return (ARK_SUCCESS);
}